

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_buf.h
# Opt level: O3

void * __thiscall bsplib::AlignedBuf::append(AlignedBuf *this,size_t extra_bytes)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  size_t __n;
  ulong uVar4;
  long lVar5;
  void *__dest;
  
  uVar1 = this->m_alignment;
  uVar4 = (extra_bytes + uVar1) - 1;
  lVar5 = uVar4 - uVar4 % uVar1;
  __n = this->m_size;
  uVar4 = __n + lVar5;
  if (this->m_capacity < uVar4) {
    uVar3 = this->m_capacity * 2;
    if (uVar3 <= uVar4) {
      uVar3 = uVar4;
    }
    pvVar2 = malloc(uVar1 * 2 + uVar3);
    uVar4 = (uVar1 - 1) + (long)pvVar2;
    __dest = (void *)(uVar4 - uVar4 % uVar1);
    memcpy(__dest,this->m_aligned_ptr,__n);
    free(this->m_ptr);
    this->m_ptr = pvVar2;
    this->m_aligned_ptr = __dest;
    this->m_capacity = uVar3;
    __n = this->m_size;
    uVar4 = lVar5 + __n;
  }
  else {
    __dest = this->m_aligned_ptr;
  }
  this->m_size = uVar4;
  return (void *)(__n + (long)__dest);
}

Assistant:

void * append( size_t extra_bytes ) {
        extra_bytes = align( extra_bytes );
        if ( m_size + extra_bytes > m_capacity ) {
            size_t newsize = std::max( 2 * m_capacity, m_size + extra_bytes );
            void * ptr = std::malloc( newsize + 2*m_alignment );
            void * aligned_ptr = align( ptr );
            std::memcpy( aligned_ptr, m_aligned_ptr, m_size );

            std::free( m_ptr );
            m_ptr = ptr;
            m_aligned_ptr = aligned_ptr; 
            m_capacity = newsize;
        }

        void * result = static_cast<char*>( m_aligned_ptr ) + m_size;
        m_size += extra_bytes;
        return result;
    }